

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlfield.cpp
# Opt level: O2

void __thiscall QSqlField::setAutoValue(QSqlField *this,bool autoVal)

{
  QSqlFieldPrivate *pQVar1;
  
  QExplicitlySharedDataPointer<QSqlFieldPrivate>::detach(&this->d);
  pQVar1 = (this->d).d.ptr;
  pQVar1->field_0x70 = pQVar1->field_0x70 & 0xfb | autoVal << 2;
  return;
}

Assistant:

void QSqlField::setAutoValue(bool autoVal)
{
    detach();
    d->autoval = autoVal;
}